

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall tinyusdz::AttrMetas::authored(AttrMetas *this)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((((this->interpolation).has_value_ == false) && ((this->elementSize).has_value_ == false))
       && ((this->hidden).has_value_ == false)) &&
      ((((this->customData).has_value_ == false && ((this->weight).has_value_ == false)) &&
       (((this->connectability).has_value_ == false &&
        (((this->outputName).has_value_ == false && ((this->renderType).has_value_ == false))))))))
     && (((this->sdrMetadata).has_value_ == false &&
         (((((this->displayName).has_value_ == false && ((this->displayGroup).has_value_ == false))
           && ((this->bindMaterialAs).has_value_ == false)) &&
          ((this->meta)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))))) {
    bVar1 = (this->stringData).
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this->stringData).
            super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  return bVar1;
}

Assistant:

bool authored() const {
    return (interpolation || elementSize || hidden || customData || weight ||
            connectability || outputName || renderType || sdrMetadata || displayName || displayGroup || bindMaterialAs || meta.size() || stringData.size());
  }